

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O3

Result * CoreML::validateClassifierFeatureDescriptions_<CoreML::Specification::FunctionDescription>
                   (Result *__return_storage_ptr__,FunctionDescription *interface,
                   bool expected_class_is_int64)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  void *pvVar3;
  pointer pcVar4;
  long lVar5;
  bool bVar6;
  Result *result;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar7;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_49;
  string local_48;
  TypeCase local_28 [2];
  
  pRVar7 = (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
           ((ulong)(interface->predictedfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
  lVar2._0_4_ = (pRVar7->super_RepeatedPtrFieldBase).current_size_;
  lVar2._4_4_ = (pRVar7->super_RepeatedPtrFieldBase).total_size_;
  if (lVar2 == 0) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Specification is missing classifier predictedFeatureName","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pvVar3 = (interface->predictedprobabilitiesname_).tagged_ptr_.ptr_;
    local_28[0] = (uint)!expected_class_is_int64 * 2 + 1;
    __l._M_len = 1;
    __l._M_array = local_28;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_48,__l,&local_49);
    validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (__return_storage_ptr__,(CoreML *)&interface->output_,pRVar7,&local_48,in_R8);
    if (local_48._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_48._M_dataplus._M_p,
                      local_48.field_2._M_allocated_capacity - (long)local_48._M_dataplus._M_p);
    }
    bVar6 = Result::good(__return_storage_ptr__);
    if (bVar6) {
      pRVar7 = (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)
               ((ulong)pvVar3 & 0xfffffffffffffffe);
      pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      paVar1 = &(__return_storage_ptr__->m_message).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 != paVar1) {
        operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
      }
      lVar5._0_4_ = (pRVar7->super_RepeatedPtrFieldBase).current_size_;
      lVar5._4_4_ = (pRVar7->super_RepeatedPtrFieldBase).total_size_;
      if (lVar5 != 0) {
        local_28[0] = kMultiArrayType;
        local_28[1] = kDictionaryType;
        __l_00._M_len = 2;
        __l_00._M_array = local_28;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)&local_48,__l_00,&local_49);
        validateDescriptionsContainFeatureWithNameAndType<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                  (__return_storage_ptr__,(CoreML *)&interface->output_,pRVar7,&local_48,in_R8);
        if (local_48._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_48._M_dataplus._M_p,
                          local_48.field_2._M_allocated_capacity - (long)local_48._M_dataplus._M_p);
        }
        bVar6 = Result::good(__return_storage_ptr__);
        if (!bVar6) {
          return __return_storage_ptr__;
        }
        pcVar4 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateClassifierFeatureDescriptions_(const Description& interface,
                                                         bool expected_class_is_int64) {

        const auto& predictedFeatureName = interface.predictedfeaturename();
        const auto& probOutputName = interface.predictedprobabilitiesname();

        if (predictedFeatureName.empty()) {
            return Result(ResultType::INVALID_MODEL_INTERFACE,
                          "Specification is missing classifier predictedFeatureName");
        } else {
            auto expected_class = (expected_class_is_int64
                                   ? Specification::FeatureType::TypeCase::kInt64Type
                                   : Specification::FeatureType::TypeCase::kStringType);

            auto result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                            predictedFeatureName,
                                                                            {expected_class});
            if (!result.good()) {
                return result;
            }
        }

        if (!probOutputName.empty()) {
            // TODO @znation: validate array length below
            // and value type (must be double? different for different classifiers?)
            // TODO Probability outputs are always dictionaries!
            auto result = validateDescriptionsContainFeatureWithNameAndType(interface.output(),
                                                                            probOutputName,
                                                                            {Specification::FeatureType::TypeCase::kMultiArrayType, // TODO ARRAY TYPE IS INVALID, REMOVE
                                                                            Specification::FeatureType::TypeCase::kDictionaryType});
            if (!result.good()) {
                return result;
            }
        }

        return Result();
    }